

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptorKeyAndModuleName
          (Generator *this,ServiceDescriptor *descriptor)

{
  Printer *pPVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  pPVar1 = this->printer_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"DESCRIPTOR",&local_59);
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_38,this,descriptor);
  io::Printer::Print(pPVar1,"$descriptor_key$ = $descriptor_name$,\n","descriptor_key",&local_58,
                     "descriptor_name",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = this->printer_;
  anon_unknown_0::ModuleName(&local_58,*(string **)this->file_);
  io::Printer::Print(pPVar1,"__module__ = \'$module_name$\'\n","module_name",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Generator::PrintDescriptorKeyAndModuleName(
    const ServiceDescriptor& descriptor) const {
  printer_->Print(
      "$descriptor_key$ = $descriptor_name$,\n",
      "descriptor_key", kDescriptorKey,
      "descriptor_name", ModuleLevelServiceDescriptorName(descriptor));
  printer_->Print(
      "__module__ = '$module_name$'\n",
      "module_name", ModuleName(file_->name()));
}